

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rational.cpp
# Opt level: O2

void (anonymous_namespace)::test_assignment_from_value<unsigned_long,unsigned_long>(void)

{
  ResultBuilder *pRVar1;
  int local_2fc;
  value_type_conflict7 local_2f8;
  SourceLineInfo local_2f0;
  rational<unsigned_long> local_2c8;
  ResultBuilder __catchResult;
  
  local_2c8.num_ = 1;
  local_2c8.denom_ = 10;
  tcb::rational<unsigned_long>::simplify(&local_2c8);
  local_2c8.num_ = 3;
  local_2c8.denom_ = 1;
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
             ,0x73);
  Catch::ResultBuilder::ResultBuilder(&__catchResult,"REQUIRE",&local_2f0,"r.num() == 3",Normal,"");
  std::__cxx11::string::~string((string *)&local_2f0);
  local_2f8 = local_2c8.num_;
  local_2fc = 3;
  local_2f0.file._M_dataplus._M_p = (pointer)&__catchResult;
  local_2f0.file._M_string_length = (size_type)&local_2f8;
  pRVar1 = Catch::ExpressionLhs<unsigned_long_const&>::
           captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<unsigned_long_const&> *)&local_2f0,&local_2fc);
  Catch::ResultBuilder::endExpression(pRVar1);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
             ,0x74);
  Catch::ResultBuilder::ResultBuilder
            (&__catchResult,"REQUIRE",&local_2f0,"r.denom() == 1",Normal,"");
  std::__cxx11::string::~string((string *)&local_2f0);
  local_2f8 = local_2c8.denom_;
  local_2fc = 1;
  local_2f0.file._M_dataplus._M_p = (pointer)&__catchResult;
  local_2f0.file._M_string_length = (size_type)&local_2f8;
  pRVar1 = Catch::ExpressionLhs<unsigned_long_const&>::
           captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<unsigned_long_const&> *)&local_2f0,&local_2fc);
  Catch::ResultBuilder::endExpression(pRVar1);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  return;
}

Assistant:

void test_assignment_from_value()
{
    using rational = tcb::rational<T>;

    rational r{1, 10};
    r = static_cast<U>(3);
    REQUIRE(r.num() == 3);
    REQUIRE(r.denom() == 1);
}